

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
produce_begin_multi_dim
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          item_event_visitor *visitor,semantic_tag tag,error_code *ec)

{
  cbor_major_type cVar1;
  uint8_t uVar2;
  bool bVar3;
  ssize_t sVar4;
  assertion_error *this_00;
  error_code *in_RCX;
  ser_context *in_RSI;
  error_code *in_RDI;
  uint8_t info;
  cbor_major_type major_type;
  uint8_t b;
  string *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  span<const_unsigned_long,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffaf;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffffb0;
  uint8_t local_21;
  error_code *local_20;
  ser_context *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  sVar4 = stream_source<unsigned_char>::read
                    ((stream_source<unsigned_char> *)(in_RDI + 3),(int)&local_21,(void *)0x1,
                     (size_t)in_RCX);
  if (sVar4 == 0) {
    std::error_code::operator=(in_RDI,(cbor_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    *(undefined1 *)&in_RDI->_M_cat = 0;
  }
  else {
    cVar1 = get_major_type(local_21);
    if (cVar1 != array) {
      uVar5 = 1;
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb0,
                 (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (allocator<char> *)
                 CONCAT44(in_stack_ffffffffffffffa4,
                          CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0))));
      assertion_error::assertion_error(this_00,in_stack_ffffffffffffff68);
      __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
    }
    uVar2 = get_additional_information_value(local_21);
    read_shape(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,
               (error_code *)
               CONCAT44(in_stack_ffffffffffffffa4,
                        CONCAT13(in_stack_ffffffffffffffa3,CONCAT12(uVar2,in_stack_ffffffffffffffa0)
                                )));
    bVar3 = std::error_code::operator_cast_to_bool(local_20);
    if (!bVar3) {
      std::vector<jsoncons::cbor::parse_state,std::allocator<jsoncons::cbor::parse_state>>::
      emplace_back<jsoncons::cbor::parse_mode,int>
                ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                  *)in_RDI,(parse_mode *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      jsoncons::detail::span<unsigned_long_const,18446744073709551615ul>::
      span<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((span<const_unsigned_long,_18446744073709551615UL> *)in_RDI,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70);
      basic_item_event_visitor<char>::begin_multi_dim
                ((basic_item_event_visitor<char> *)in_RDI,in_stack_ffffffffffffff78,
                 (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x38),local_10,
                 (error_code *)0x2e6507);
      *(byte *)&in_RDI->_M_cat = (*(byte *)((long)&in_RDI->_M_cat + 2) ^ 0xff) & 1;
    }
  }
  return;
}

Assistant:

void produce_begin_multi_dim(item_event_visitor& visitor, 
                                 semantic_tag tag,
                                 std::error_code& ec)
    {
        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(b);
        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::array);
        uint8_t info = get_additional_information_value(b);
       
        read_shape(info, ec);   
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }

        state_stack_.emplace_back(parse_mode::multi_dim, 0);
        visitor.begin_multi_dim(shape_, tag, *this, ec);
        more_ = !cursor_mode_;
    }